

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O1

void __thiscall
jsoncons::
sorted_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>,_std::vector>
::uninitialized_init
          (sorted_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>,_std::vector>
           *this,index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
                 *items,size_t count)

{
  key_value_container_type *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
  *this_01;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_> local_58;
  size_t sVar5;
  
  if (count != 0) {
    this_00 = &this->members_;
    std::
    vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>
    ::reserve(this_00,count);
    lVar4 = 0x3f;
    if (count != 0) {
      for (; count >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>const&,jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>const&)>>
              (items,items + count,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_&,_const_jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_&)>
                )0x7b0e80);
    std::
    __final_insertion_sort<jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>const&,jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>const&)>>
              (items,items + count,
               (_Iter_comp_iter<bool_(*)(const_jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_&,_const_jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_&)>
                )0x7b0e80);
    pcVar2 = (items->name)._M_dataplus._M_p;
    local_58._M_dataplus.super_allocator_type._M_resource =
         (this->super_allocator_holder<std::pmr::polymorphic_allocator<char>_>).alloc_._M_resource;
    paVar1 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>> *)
               &local_58,pcVar2,pcVar2 + (items->name)._M_string_length);
    std::
    vector<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>,std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>>>
    ::
    emplace_back<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>
              ((vector<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>,std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>>>
                *)this_00,&local_58,&items->value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      (**(code **)(*(long *)local_58._M_dataplus.super_allocator_type._M_resource + 0x18))
                (local_58._M_dataplus.super_allocator_type._M_resource,local_58._M_dataplus._M_p,
                 local_58.field_2._M_allocated_capacity + 1,1);
    }
    if (count != 1) {
      sVar5 = 2;
      if (2 < count) {
        sVar5 = count;
      }
      lVar4 = sVar5 - 1;
      this_01 = items + 1;
      do {
        iVar3 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>::
                compare(&this_01->name,&this_01[-1].name);
        if (iVar3 != 0) {
          pcVar2 = (this_01->name)._M_dataplus._M_p;
          local_58._M_dataplus.super_allocator_type._M_resource =
               (this->super_allocator_holder<std::pmr::polymorphic_allocator<char>_>).alloc_.
               _M_resource;
          local_58._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::
          basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>::
          _M_construct<char_const*>
                    ((basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>
                      *)&local_58,pcVar2,pcVar2 + (this_01->name)._M_string_length);
          std::
          vector<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>,std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>>>
          ::
          emplace_back<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>
                    ((vector<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>,std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>>>
                      *)this_00,&local_58,&this_01->value);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>_11
               *)local_58._M_dataplus._M_p != paVar1) {
            (**(code **)(*(long *)local_58._M_dataplus.super_allocator_type._M_resource + 0x18))
                      (local_58._M_dataplus.super_allocator_type._M_resource,
                       local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1,1);
          }
        }
        this_01 = this_01 + 1;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
  }
  return;
}

Assistant:

void uninitialized_init(index_key_value<Json>* items, std::size_t count)
        {
            if (count > 0)
            {
                members_.reserve(count);

                std::sort(items, items+count, compare);
                members_.emplace_back(key_type(items[0].name.data(), items[0].name.size(), get_allocator()), std::move(items[0].value));
                
                for (std::size_t i = 1; i < count; ++i)
                {
                    auto& item = items[i];
                    if (item.name != items[i-1].name)
                    {
                        members_.emplace_back(key_type(item.name.data(), item.name.size(), get_allocator()), std::move(item.value));
                    }
                }
            }
        }